

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

int resolve_absolute_schema_nodeid(char *nodeid,lys_module *module,int ret_nodetype,lys_node **ret)

{
  uint uVar1;
  int iVar2;
  lys_module *module_00;
  lys_node *last;
  lys_node *parent;
  char *local_60;
  char *name;
  char *local_50;
  char *mod_name;
  int local_3c;
  int local_38;
  int nam_len;
  int mod_name_len;
  int is_relative;
  
  nam_len = -1;
  if (((nodeid == (char *)0x0) || (module == (lys_module *)0x0)) || (ret == (lys_node **)0x0)) {
    __assert_fail("nodeid && module && ret",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x8c3,
                  "int resolve_absolute_schema_nodeid(const char *, const struct lys_module *, int, const struct lys_node **)"
                 );
  }
  if (((ret_nodetype & 0x3000U) != 0) ||
     (((uint)ret_nodetype >> 0xb & 1) != 0 && ret_nodetype != 0x800)) {
    __assert_fail("!(ret_nodetype & (LYS_USES | LYS_AUGMENT)) && ((ret_nodetype == LYS_GROUPING) || !(ret_nodetype & LYS_GROUPING))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x8c4,
                  "int resolve_absolute_schema_nodeid(const char *, const struct lys_module *, int, const struct lys_node **)"
                 );
  }
  uVar1 = parse_schema_nodeid(nodeid,&local_50,&local_38,&local_60,&local_3c,&nam_len,(int *)0x0,
                              (int *)0x0,0);
  if ((int)uVar1 < 1) {
    iVar2 = 1 - uVar1;
  }
  else {
    iVar2 = -1;
    if (nam_len == 0) {
      module_00 = lyp_get_module(module,(char *)0x0,0,local_50,local_38,0);
      if (module_00 != (lys_module *)0x0) {
        mod_name = nodeid;
        parent = (lys_node *)0x0;
        name = (char *)ret;
        do {
          mod_name = mod_name + uVar1;
          last = (lys_node *)0x0;
          while( true ) {
            do {
              last = lys_getnext(last,parent,module_00,0x10f);
              if (last == (lys_node *)0x0) {
                name[0] = '\0';
                name[1] = '\0';
                name[2] = '\0';
                name[3] = '\0';
                name[4] = '\0';
                name[5] = '\0';
                name[6] = '\0';
                name[7] = '\0';
                return 0;
              }
              iVar2 = schema_nodeid_siblingcheck(last,module,local_50,local_38,local_60,local_3c);
            } while (iVar2 == 1);
            if (iVar2 != 0) goto LAB_00113200;
            if (*mod_name != '\0') break;
            if ((last->nodetype & ret_nodetype) != LYS_UNKNOWN) {
              *(lys_node **)name = last;
              return 0;
            }
          }
          uVar1 = parse_schema_nodeid(mod_name,&local_50,&local_38,&local_60,&local_3c,&nam_len,
                                      (int *)0x0,(int *)0x0,0);
          parent = last;
          if ((int)uVar1 < 1) {
            return ((int)mod_name - ((int)nodeid + uVar1)) + 1;
          }
        } while( true );
      }
LAB_00113200:
      iVar2 = -1;
    }
  }
  return iVar2;
}

Assistant:

int
resolve_absolute_schema_nodeid(const char *nodeid, const struct lys_module *module, int ret_nodetype,
                               const struct lys_node **ret)
{
    const char *name, *mod_name, *id;
    const struct lys_node *sibling, *start_parent;
    int r, nam_len, mod_name_len, is_relative = -1;
    const struct lys_module *abs_start_mod;

    assert(nodeid && module && ret);
    assert(!(ret_nodetype & (LYS_USES | LYS_AUGMENT)) && ((ret_nodetype == LYS_GROUPING) || !(ret_nodetype & LYS_GROUPING)));

    id = nodeid;
    start_parent = NULL;

    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, NULL, NULL, 0)) < 1) {
        return ((id - nodeid) - r) + 1;
    }
    id += r;

    if (is_relative) {
        return -1;
    }

    abs_start_mod = lyp_get_module(module, NULL, 0, mod_name, mod_name_len, 0);
    if (!abs_start_mod) {
        return -1;
    }

    while (1) {
        sibling = NULL;
        while ((sibling = lys_getnext(sibling, start_parent, abs_start_mod, LYS_GETNEXT_WITHCHOICE
                | LYS_GETNEXT_WITHCASE | LYS_GETNEXT_WITHINOUT | LYS_GETNEXT_WITHGROUPING | LYS_GETNEXT_NOSTATECHECK))) {
            r = schema_nodeid_siblingcheck(sibling, module, mod_name, mod_name_len, name, nam_len);
            if (r == 0) {
                if (!id[0]) {
                    if (!(sibling->nodetype & ret_nodetype)) {
                        /* wrong node type, too bad */
                        continue;
                    }
                    *ret = sibling;
                    return EXIT_SUCCESS;
                }
                start_parent = sibling;
                break;
            } else if (r == 1) {
                continue;
            } else {
                return -1;
            }
        }

        /* no match */
        if (!sibling) {
            *ret = NULL;
            return EXIT_SUCCESS;
        }

        if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, NULL, NULL, 0)) < 1) {
            return ((id - nodeid) - r) + 1;
        }
        id += r;
    }

    /* cannot get here */
    LOGINT(module->ctx);
    return -1;
}